

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

ContextType deqp::egl::anon_unknown_1::attribListToContextType(EGLint *attribList)

{
  Profile profile;
  ContextFlags flags;
  EGLint robustAccessExt;
  EGLint minorVersion;
  EGLint majorVersion;
  EGLint *attribList_local;
  
  robustAccessExt = 1;
  flags = 0;
  profile = PROFILE_ES;
  _minorVersion = attribList;
  parseAttributeValues(attribList,&robustAccessExt,(EGLint *)&flags,(EGLint *)&profile);
  glu::ContextType::ContextType
            ((ContextType *)((long)&attribList_local + 4),robustAccessExt,flags,PROFILE_ES,0);
  return (ApiType)(ApiType)attribList_local._4_4_;
}

Assistant:

glu::ContextType attribListToContextType (const EGLint* attribList)
{
	EGLint				majorVersion	= 1;
	EGLint				minorVersion	= 0;
	EGLint				robustAccessExt = 0;

	glu::ContextFlags	flags			= glu::ContextFlags(0);
	const glu::Profile	profile			= glu::PROFILE_ES;
	parseAttributeValues(attribList, majorVersion, minorVersion, robustAccessExt);

	return glu::ContextType(majorVersion, minorVersion, profile, flags);
}